

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

IterationConfig * __thiscall
deqp::gles31::Functional::anon_unknown_1::PointRenderCase::generateConfig
          (IterationConfig *__return_storage_ptr__,PointRenderCase *this,int iteration,
          IVec2 *renderTargetSize)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  BBoxRenderCase::generateRandomConfig
            (__return_storage_ptr__,&this->super_BBoxRenderCase,iteration * 0xdedede,
             renderTargetSize);
  if ((this->super_BBoxRenderCase).m_bboxSize < BBOXSIZE_SMALLER) {
    uVar1 = *(undefined8 *)(__return_storage_ptr__->patternSize).m_data;
    fVar11 = (float)uVar1;
    fVar9 = (float)((ulong)uVar1 >> 0x20);
    if ((this->super_BBoxRenderCase).m_hasTessellationStage == true) {
      fVar10 = fVar11 * 0.07;
      fVar2 = (__return_storage_ptr__->bbox).min.m_data[1];
      fVar3 = (__return_storage_ptr__->bbox).min.m_data[2];
      fVar4 = (__return_storage_ptr__->bbox).min.m_data[3];
      fVar5 = (__return_storage_ptr__->bbox).max.m_data[0];
      fVar6 = (__return_storage_ptr__->bbox).max.m_data[1];
      fVar7 = (__return_storage_ptr__->bbox).max.m_data[2];
      fVar8 = (__return_storage_ptr__->bbox).max.m_data[3];
      (__return_storage_ptr__->bbox).min.m_data[0] =
           (__return_storage_ptr__->bbox).min.m_data[0] - fVar10;
      (__return_storage_ptr__->bbox).min.m_data[1] = fVar2 - fVar9 * 0.07;
      (__return_storage_ptr__->bbox).min.m_data[2] = fVar3 - 0.0;
      (__return_storage_ptr__->bbox).min.m_data[3] = fVar4 - 0.0;
      (__return_storage_ptr__->bbox).max.m_data[0] = fVar5 + fVar10;
      (__return_storage_ptr__->bbox).max.m_data[1] = fVar6 + fVar9 * 0.07;
      (__return_storage_ptr__->bbox).max.m_data[2] = fVar7 + 0.0;
      (__return_storage_ptr__->bbox).max.m_data[3] = fVar8 + 0.0;
    }
    if ((this->super_BBoxRenderCase).m_hasGeometryStage == true) {
      fVar11 = fVar11 * 0.05;
      fVar2 = (__return_storage_ptr__->bbox).min.m_data[1];
      fVar3 = (__return_storage_ptr__->bbox).min.m_data[2];
      fVar4 = (__return_storage_ptr__->bbox).min.m_data[3];
      fVar5 = (__return_storage_ptr__->bbox).max.m_data[0];
      fVar6 = (__return_storage_ptr__->bbox).max.m_data[1];
      fVar7 = (__return_storage_ptr__->bbox).max.m_data[2];
      fVar8 = (__return_storage_ptr__->bbox).max.m_data[3];
      (__return_storage_ptr__->bbox).min.m_data[0] =
           (__return_storage_ptr__->bbox).min.m_data[0] - fVar11;
      (__return_storage_ptr__->bbox).min.m_data[1] = fVar2 - fVar9 * 0.02;
      (__return_storage_ptr__->bbox).min.m_data[2] = fVar3 - 0.0;
      (__return_storage_ptr__->bbox).min.m_data[3] = fVar4 - 0.0;
      (__return_storage_ptr__->bbox).max.m_data[0] = fVar11 + fVar5;
      (__return_storage_ptr__->bbox).max.m_data[1] = fVar9 * 0.03 + fVar6;
      (__return_storage_ptr__->bbox).max.m_data[2] = fVar7 + 0.0;
      (__return_storage_ptr__->bbox).max.m_data[3] = fVar8 + 0.0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

PointRenderCase::IterationConfig PointRenderCase::generateConfig (int iteration, const tcu::IVec2& renderTargetSize) const
{
	IterationConfig config = generateRandomConfig(0xDEDEDEu * (deUint32)iteration, renderTargetSize);

	// equal or larger -> expand according to shader expansion
	if (m_bboxSize == BBOXSIZE_EQUAL || m_bboxSize == BBOXSIZE_LARGER)
	{
		const tcu::Vec2 patternScale = config.patternSize;

		if (m_hasTessellationStage)
		{
			config.bbox.min -= tcu::Vec4(0.07f * patternScale.x(), 0.07f * patternScale.y(), 0.0f, 0.0f);
			config.bbox.max += tcu::Vec4(0.07f * patternScale.x(), 0.07f * patternScale.y(), 0.0f, 0.0f);
		}
		if (m_hasGeometryStage)
		{
			config.bbox.min -= tcu::Vec4(0.05f * patternScale.x(), 0.02f * patternScale.y(), 0.0f, 0.0f);
			config.bbox.max += tcu::Vec4(0.05f * patternScale.x(), 0.03f * patternScale.y(), 0.0f, 0.0f);
		}
	}

	return config;
}